

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O1

aabb * operator+(aabb *__return_storage_ptr__,aabb *bbox,vec3 *offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = offset->e[0];
  dVar2 = offset->e[1];
  dVar3 = (bbox->x).max;
  dVar4 = (bbox->y).min;
  dVar5 = (bbox->y).max;
  dVar6 = offset->e[2];
  dVar7 = (bbox->z).min;
  dVar8 = (bbox->z).max;
  (__return_storage_ptr__->x).min = (bbox->x).min + dVar1;
  (__return_storage_ptr__->x).max = dVar1 + dVar3;
  (__return_storage_ptr__->y).min = dVar4 + dVar2;
  (__return_storage_ptr__->y).max = dVar2 + dVar5;
  (__return_storage_ptr__->z).min = dVar7 + dVar6;
  (__return_storage_ptr__->z).max = dVar6 + dVar8;
  aabb::pad_to_minimums(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

aabb(const interval& x, const interval& y, const interval& z)
      : x(x), y(y), z(z)
    {
        pad_to_minimums();
    }